

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::uniformi_invalid_program
               (NegativeTestContext *ctx)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if there is no current program object.",&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glUniform1i(&ctx->super_CallLogWrapper,-1,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform2i(&ctx->super_CallLogWrapper,-1,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform3i(&ctx->super_CallLogWrapper,-1,0,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniform4i(&ctx->super_CallLogWrapper,-1,0,0,0,0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void uniformi_invalid_program (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_OPERATION is generated if there is no current program object.");
	ctx.glUseProgram(0);
	ctx.glUniform1i(-1, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2i(-1, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3i(-1, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4i(-1, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();
}